

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::CleanupBackwardPassInfoInFlowGraph(BackwardPass *this)

{
  undefined1 *puVar1;
  FlowGraph *pFVar2;
  BasicBlock *pBVar3;
  
  pFVar2 = this->func->m_fg;
  if (pFVar2->hasBackwardPassInfo == true) {
    for (pBVar3 = pFVar2->blockList; pBVar3 != (BasicBlock *)0x0; pBVar3 = pBVar3->next) {
      if ((*(ushort *)&pBVar3->field_0x18 & 3) != 1) {
        pBVar3->slotDeadStoreCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->tempNumberTracker = (TempNumberTracker *)0x0;
        pBVar3->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->typesNeedingKnownObjectLayout = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->liveFixedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->tempObjectTracker = (TempObjectTracker *)0x0;
        pBVar3->excludeByteCodeUpwardExposedTracking = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->tempObjectVerifyTracker = (TempObjectVerifyTracker *)0x0;
        pBVar3->stackSymToFinalType =
             (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0;
        pBVar3->stackSymToGuardedProperties =
             (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0;
        pBVar3->stackSymToWriteGuardsMap =
             (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0;
        pBVar3->noImplicitCallUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->noImplicitCallNoMissingValuesUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->noImplicitCallNativeArrayUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->noImplicitCallJsArrayHeadSegmentSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0
        ;
        pBVar3->noImplicitCallArrayLengthSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->couldRemoveNegZeroBailoutForDef = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        pBVar3->byteCodeRestoreSyms = (StackSym **)0x0;
        if (pBVar3->loop != (Loop *)0x0) {
          puVar1 = &pBVar3->loop->field_0x178;
          *puVar1 = *puVar1 & 0xfd;
          puVar1 = &pBVar3->loop->field_0x178;
          *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffb;
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::CleanupBackwardPassInfoInFlowGraph()
{
    if (!this->func->m_fg->hasBackwardPassInfo)
    {
        // No information to clean up
        return;
    }

    // The backward pass temp arena has already been deleted, we can just reset the data

    FOREACH_BLOCK_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        block->upwardExposedUses = nullptr;
        block->upwardExposedFields = nullptr;
        block->typesNeedingKnownObjectLayout = nullptr;
        block->slotDeadStoreCandidates = nullptr;
        block->byteCodeUpwardExposedUsed = nullptr;
        block->liveFixedFields = nullptr;
#if DBG
        block->byteCodeRestoreSyms = nullptr;
        block->excludeByteCodeUpwardExposedTracking = nullptr;
#endif
        block->tempNumberTracker = nullptr;
        block->tempObjectTracker = nullptr;
#if DBG
        block->tempObjectVerifyTracker = nullptr;
#endif
        block->stackSymToFinalType = nullptr;
        block->stackSymToGuardedProperties = nullptr;
        block->stackSymToWriteGuardsMap = nullptr;
        block->cloneStrCandidates = nullptr;
        block->noImplicitCallUses = nullptr;
        block->noImplicitCallNoMissingValuesUses = nullptr;
        block->noImplicitCallNativeArrayUses = nullptr;
        block->noImplicitCallJsArrayHeadSegmentSymUses = nullptr;
        block->noImplicitCallArrayLengthSymUses = nullptr;
        block->couldRemoveNegZeroBailoutForDef = nullptr;

        if (block->loop != nullptr)
        {
            block->loop->hasDeadStoreCollectionPass = false;
            block->loop->hasDeadStorePrepass = false;
        }
    }
    NEXT_BLOCK_IN_FUNC_DEAD_OR_ALIVE;
}